

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_crypto.c
# Opt level: O0

void test_archive_sha512(void)

{
  int iVar1;
  uchar actualmd [65];
  uchar md [64];
  uchar buf [1];
  archive_sha512_ctx ctx;
  char *in_stack_ffffffffffffff50;
  longlong in_stack_ffffffffffffff58;
  wchar_t in_stack_ffffffffffffff64;
  char *in_stack_ffffffffffffff68;
  void *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff90;
  void *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  void *in_stack_ffffffffffffffa8;
  wchar_t in_stack_ffffffffffffffb4;
  char *in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  void *in_stack_ffffffffffffffe0;
  undefined1 local_2;
  archive_sha512_ctx local_1;
  
  memset(&local_2,0,1);
  memcpy(&stack0xffffffffffffff68,&DAT_002c9980,0x41);
  iVar1 = __archive_stub_sha512init(&local_1);
  if (iVar1 == 0) {
    __archive_stub_sha512update(&local_1,&local_2,1);
    assertion_equal_int(in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                        in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,0,(char *)0x124e12,
                        in_stack_ffffffffffffff80);
    __archive_stub_sha512final(&local_1,&stack0xffffffffffffffb8);
    assertion_equal_int(in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                        in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,0,(char *)0x124e5d,
                        in_stack_ffffffffffffff80);
    assertion_equal_mem(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
                        in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                        in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                        in_stack_ffffffffffffffd0,in_stack_ffffffffffffffd8,
                        in_stack_ffffffffffffffe0);
  }
  else {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_crypto.c"
                   ,L'\x8b');
    test_skipping("This platform does not support SHA512");
  }
  return;
}

Assistant:

DEFINE_TEST(test_archive_sha512)
{
	archive_sha512_ctx ctx;
	unsigned char buf[] = "";
	unsigned char md[64];
	unsigned char actualmd[] = "\xb8\x24\x4d\x02\x89\x81\xd6\x93"
                             "\xaf\x7b\x45\x6a\xf8\xef\xa4\xca"
                             "\xd6\x3d\x28\x2e\x19\xff\x14\x94"
                             "\x2c\x24\x6e\x50\xd9\x35\x1d\x22"
                             "\x70\x4a\x80\x2a\x71\xc3\x58\x0b"
                             "\x63\x70\xde\x4c\xeb\x29\x3c\x32"
                             "\x4a\x84\x23\x34\x25\x57\xd4\xe5"
                             "\xc3\x84\x38\xf0\xe3\x69\x10\xee";

	if (ARCHIVE_OK != archive_sha512_init(&ctx)) {
		skipping("This platform does not support SHA512");
		return;
	}
	assertEqualInt(ARCHIVE_OK, archive_sha512_update(&ctx, buf, sizeof(buf)));
	assertEqualInt(ARCHIVE_OK, archive_sha512_final(&ctx, md));
	assertEqualMem(md, actualmd, sizeof(md));
}